

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>
::int_writer<wchar_t,fmt::v5::basic_format_specs<wchar_t>>::dec_writer::operator()
          (dec_writer *this,
          back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_> *it)

{
  bool bVar1;
  char *pcVar2;
  back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_> bVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  char *__last;
  long lVar7;
  char local_15 [13];
  
  uVar6 = *(uint *)this;
  __last = local_15 + *(int *)(this + 4);
  pcVar2 = __last;
  uVar5 = uVar6;
  if (99 < uVar6) {
    do {
      uVar5 = uVar6 / 100;
      *(undefined2 *)(pcVar2 + -2) =
           *(undefined2 *)(internal::basic_data<void>::DIGITS + (ulong)(uVar6 % 100) * 2);
      pcVar2 = pcVar2 + -2;
      bVar1 = 9999 < uVar6;
      uVar6 = uVar6 / 100;
    } while (bVar1);
  }
  bVar3 = (back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>)it->container;
  if (uVar5 < 10) {
    bVar4 = (byte)uVar5 | 0x30;
    lVar7 = -1;
  }
  else {
    pcVar2[-1] = internal::basic_data<void>::DIGITS[((ulong)uVar5 * 2 & 0xffffffff) + 1];
    bVar4 = internal::basic_data<void>::DIGITS[(ulong)uVar5 * 2];
    lVar7 = -2;
  }
  pcVar2[lVar7] = bVar4;
  bVar3 = std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<char*,std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>>
                    (local_15,__last,bVar3);
  it->container = (vector<wchar_t,_std::allocator<wchar_t>_> *)bVar3;
  return;
}

Assistant:

void operator()(It &&it) const {
        it = internal::format_decimal<char_type>(it, abs_value, num_digits);
      }